

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polevl.c
# Opt level: O2

double polevl(double x,double *coef,int N)

{
  long lVar1;
  double dVar2;
  
  dVar2 = *coef;
  lVar1 = 0;
  do {
    dVar2 = dVar2 * x + coef[lVar1 + 1];
    lVar1 = lVar1 + 1;
  } while (N != (int)lVar1);
  return dVar2;
}

Assistant:

double polevl( x, coef, N )
double x;
double coef[];
int N;
{
double ans;
int i;
double *p;

p = coef;
ans = *p++;
i = N;

do
	ans = ans * x  +  *p++;
while( --i );

return( ans );
}